

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::LoadRange(DBImpl *this,string *fname,string *start,string *end)

{
  _func_int **pp_Var1;
  Table *pTVar2;
  _Alloc_hider _Var3;
  Comparator *pCVar4;
  int iVar5;
  Iterator *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *in_R8;
  bool bVar7;
  Table *table;
  RandomAccessFile *file;
  uint64_t file_size;
  WriteBatch batch;
  Options options;
  Table *local_100;
  RandomAccessFile *local_f8;
  Slice local_f0;
  string *local_e0;
  Slice local_d8;
  uint64_t local_c8;
  WriteBatch local_c0;
  Options local_a0;
  ReadOptions local_40;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_f8 = (RandomAccessFile *)0x0;
  local_100 = (Table *)0x0;
  (**(code **)(*(long *)fname->_M_string_length + 0x58))
            (&local_a0,(long *)fname->_M_string_length,start,&local_c8);
  pCVar4 = local_a0.comparator;
  (this->super_DB)._vptr_DB = (_func_int **)local_a0.comparator;
  local_a0.comparator = (Comparator *)0x0;
  Status::~Status((Status *)&local_a0);
  if (pCVar4 == (Comparator *)0x0) {
    (**(code **)(*(long *)fname->_M_string_length + 0x18))
              (&local_a0,(long *)fname->_M_string_length,start,&local_f8);
    pCVar4 = local_a0.comparator;
    (this->super_DB)._vptr_DB = (_func_int **)local_a0.comparator;
    local_a0.comparator = (Comparator *)0x0;
    Status::~Status((Status *)&local_a0);
    bVar7 = pCVar4 == (Comparator *)0x0;
  }
  else {
    bVar7 = false;
  }
  Options::Options(&local_a0);
  local_a0.filter_policy = (FilterPolicy *)0x0;
  local_a0.compression = kSnappyCompression;
  if (bVar7) {
    Table::Open((Table *)&local_c0,&local_a0,local_f8,local_c8,&local_100);
    _Var3._M_p = local_c0.rep_._M_dataplus._M_p;
    (this->super_DB)._vptr_DB = (_func_int **)local_c0.rep_._M_dataplus._M_p;
    local_c0.rep_._M_dataplus._M_p = (pointer)0x0;
    Status::~Status((Status *)&local_c0);
    if ((_func_int **)_Var3._M_p == (_func_int **)0x0) {
      local_40.verify_checksums = false;
      local_40.fill_cache = true;
      local_40.snapshot = (Snapshot *)0x0;
      local_e0 = fname;
      pIVar6 = Table::NewIterator(local_100,&local_40);
      WriteBatch::WriteBatch(&local_c0);
      (*pIVar6->_vptr_Iterator[3])(pIVar6);
      iVar5 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
      (*pIVar6->_vptr_Iterator[8])(pIVar6);
      std::__cxx11::string::assign((char *)end,CONCAT44(extraout_var,iVar5));
      while (iVar5 = (*pIVar6->_vptr_Iterator[2])(pIVar6), (char)iVar5 != '\0') {
        iVar5 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
        (*pIVar6->_vptr_Iterator[8])(pIVar6);
        std::__cxx11::string::assign(in_R8,CONCAT44(extraout_var_00,iVar5));
        iVar5 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
        local_f0.data_ = (char *)CONCAT44(extraout_var_01,iVar5);
        iVar5 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
        local_d8.data_ = (char *)CONCAT44(extraout_var_02,iVar5);
        WriteBatch::Put(&local_c0,&local_f0,&local_d8);
        (*pIVar6->_vptr_Iterator[6])(pIVar6);
      }
      local_d8.data_ = (char *)((ulong)local_d8.data_ & 0xffffffffffffff00);
      (**(code **)((local_e0->_M_dataplus)._M_p + 0x20))(&local_f0,local_e0,&local_d8,&local_c0);
      pp_Var1 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
      local_f0.data_ = (char *)pp_Var1;
      Status::~Status((Status *)&local_f0);
      (*pIVar6->_vptr_Iterator[1])(pIVar6);
      pTVar2 = local_100;
      if (local_100 != (Table *)0x0) {
        Table::~Table(local_100);
      }
      operator_delete(pTVar2);
      if (local_f8 != (RandomAccessFile *)0x0) {
        (*local_f8->_vptr_RandomAccessFile[1])();
      }
      WriteBatch::~WriteBatch(&local_c0);
      return (Status)(char *)this;
    }
  }
  pTVar2 = local_100;
  if (local_100 != (Table *)0x0) {
    Table::~Table(local_100);
  }
  operator_delete(pTVar2);
  if (local_f8 != (RandomAccessFile *)0x0) {
    (*local_f8->_vptr_RandomAccessFile[1])();
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::LoadRange(const std::string& fname,
                   std::string* start, 
                   std::string* end){
  Status s;
  uint64_t file_size;
  RandomAccessFile* file = nullptr;
  Table* table = nullptr;

  s = env_->GetFileSize(fname, &file_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(fname, &file);
  }

  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  if (s.ok()) {
    s = Table::Open(options, file, file_size, &table);
  }

  if (!s.ok()) {
    delete table;
    delete file;
    return s;
  }

  ReadOptions readoptions;
  readoptions.fill_cache = true;
  Iterator* iter = table->NewIterator(readoptions);
  WriteBatch batch;
  //printf("START LOADING...");
  iter->SeekToFirst();
  start->assign(iter->key().data(), iter->key().size());
  for (; iter->Valid(); iter->Next()) {
    end->assign(iter->key().data(), iter->key().size());
    //printf("LOAD Key: [%s], value: [%s]\n", iter->key().ToString().c_str(), iter->value().ToString().c_str());
    batch.Put(iter->key(), iter->value());
  }
  s = Write(WriteOptions(), &batch);
  
  delete iter;
  delete table;
  delete file;
  return s;
}